

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O3

int map_contains(map m,map_key key)

{
  hash hVar1;
  pair ppVar2;
  
  if (key != (map_key)0x0 && m != (map)0x0) {
    hVar1 = (*m->hash_cb)(key);
    ppVar2 = bucket_get_pair(m->buckets + hVar1 % m->capacity,m->compare_cb,key);
    if (ppVar2 != (pair)0x0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int map_contains(map m, map_key key)
{
	if (m != NULL && key != NULL)
	{
		map_hash hash = m->hash_cb(key);

		size_t index = hash % m->capacity;

		bucket b = &m->buckets[index];

		pair p = bucket_get_pair(b, m->compare_cb, key);

		if (p != NULL)
		{
			return 0;
		}
	}

	return 1;
}